

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc,string *config)

{
  string *__rhs;
  bool bVar1;
  __type _Var2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  mapped_type *pmVar5;
  string output;
  string input;
  string macdir;
  string nativeMacdir;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  bVar1 = cmGeneratorTarget::IsBundleOnApple
                    ((this->Generator->super_cmCommonTargetGenerator).GeneratorTarget);
  if (!bVar1) {
    return;
  }
  cmOSXBundleGenerator::InitMacOSXContentDirectory
            (&local_110,
             (this->Generator->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc,config);
  __rhs = &this->FileConfig;
  bVar1 = std::operator!=(config,__rhs);
  if (bVar1) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory
              ((string *)&local_90,
               (this->Generator->OSXBundleGenerator)._M_t.
               super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
               .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc,__rhs);
    _Var2 = std::operator==(&local_110,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (_Var2) goto LAB_00303763;
  }
  psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  std::__cxx11::string::string((string *)&local_130,(string *)psVar3);
  pcVar4 = GetGlobalGenerator(this->Generator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar4,&local_130);
  std::__cxx11::string::_M_assign((string *)&local_130);
  local_90.View_._M_len = local_110._M_string_length;
  local_90.View_._M_str = local_110._M_dataplus._M_p;
  local_60.View_._M_str = local_60.Digits_;
  local_60.View_._M_len = 1;
  local_60.Digits_[0] = '/';
  cmsys::SystemTools::GetFilenameName(&local_b0,&local_130);
  cmStrCat<std::__cxx11::string>(&local_150,&local_90,&local_60,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  pcVar4 = GetGlobalGenerator(this->Generator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar4,&local_150);
  std::__cxx11::string::_M_assign((string *)&local_150);
  pcVar4 = GetGlobalGenerator(this->Generator);
  std::__cxx11::string::string((string *)&local_d0,(string *)&local_130);
  std::__cxx11::string::string((string *)&local_f0,(string *)&local_150);
  cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar4,&local_d0,&local_f0,__rhs);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Generator->Configs,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &pmVar5->ExtraFiles,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
LAB_00303763:
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc, const std::string& config)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc,
                                                                    config);

  // Reject files that collide with files from the Ninja file's native config.
  if (config != this->FileConfig) {
    std::string nativeMacdir =
      this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(
        pkgloc, this->FileConfig);
    if (macdir == nativeMacdir) {
      return;
    }
  }

  // Get the input file location.
  std::string input = source.GetFullPath();
  input = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output =
    cmStrCat(macdir, '/', cmSystemTools::GetFilenameName(input));
  output = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(
    input, output, this->FileConfig);

  // Add as a dependency to the target so that it gets called.
  this->Generator->Configs[config].ExtraFiles.push_back(std::move(output));
}